

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# innerproduct.cpp
# Opt level: O3

int __thiscall
ncnn::InnerProduct::forward(InnerProduct *this,Mat *bottom_blob,Mat *top_blob,Option *opt)

{
  uint uVar1;
  int iVar2;
  size_t sVar3;
  void *pvVar4;
  int *piVar5;
  Allocator *pAVar6;
  void *pvVar7;
  float *pfVar8;
  size_t sVar9;
  void *pvVar10;
  int iVar11;
  void *pvVar12;
  void *pvVar13;
  ulong uVar14;
  ulong uVar15;
  long lVar16;
  uint uVar17;
  int iVar18;
  long lVar19;
  void *pvVar20;
  int iVar21;
  float fVar22;
  float fVar23;
  int *out;
  void *ptr;
  void *local_b8;
  int *local_b0;
  size_t local_a8;
  Allocator *local_98;
  ulong local_80;
  void *local_58;
  Allocator *pAStack_50;
  Allocator *local_48;
  undefined8 uStack_40;
  undefined8 local_38;
  
  iVar18 = bottom_blob->w;
  iVar21 = bottom_blob->h;
  uVar1 = bottom_blob->c;
  sVar3 = bottom_blob->elemsize;
  Mat::create(top_blob,this->num_output,sVar3,opt->blob_allocator);
  pvVar4 = top_blob->data;
  if (pvVar4 == (void *)0x0) {
    return -100;
  }
  if ((long)top_blob->c * top_blob->cstep == 0) {
    return -100;
  }
  uVar17 = iVar21 * iVar18;
  if (this->use_int8_inference == false) {
    iVar18 = this->num_output;
    if (0 < (long)iVar18) {
      iVar21 = this->bias_term;
      iVar2 = this->activation_type;
      pvVar10 = (this->bias_data).data;
      pvVar20 = (this->weight_data).data;
      pvVar7 = bottom_blob->data;
      sVar3 = bottom_blob->cstep;
      pfVar8 = (float *)(this->activation_params).data;
      sVar9 = bottom_blob->elemsize;
      iVar11 = 0;
      lVar19 = 0;
      do {
        fVar22 = 0.0;
        if (iVar21 != 0) {
          fVar22 = *(float *)((long)pvVar10 + lVar19 * 4);
        }
        if (0 < (int)uVar1) {
          pvVar12 = (void *)((long)pvVar20 + (long)iVar11 * 4);
          uVar15 = 0;
          pvVar13 = pvVar7;
          do {
            if (0 < (int)uVar17) {
              uVar14 = 0;
              do {
                fVar22 = fVar22 + *(float *)((long)pvVar12 + uVar14 * 4) *
                                  *(float *)((long)pvVar13 + uVar14 * 4);
                uVar14 = uVar14 + 1;
              } while (uVar17 != uVar14);
            }
            uVar15 = uVar15 + 1;
            pvVar12 = (void *)((long)pvVar12 + (long)(int)uVar17 * 4);
            pvVar13 = (void *)((long)pvVar13 + sVar3 * sVar9);
          } while (uVar15 != uVar1);
        }
        switch(iVar2) {
        case 1:
          if (fVar22 <= 0.0) {
            fVar22 = 0.0;
          }
          break;
        case 2:
          fVar22 = fVar22 * (float)(~-(uint)(0.0 < fVar22) & (uint)*pfVar8 |
                                   -(uint)(0.0 < fVar22) & 0x3f800000);
          break;
        case 3:
          if (fVar22 <= *pfVar8) {
            fVar22 = *pfVar8;
          }
          if (pfVar8[1] < fVar22) {
            fVar22 = pfVar8[1];
          }
          break;
        case 4:
          fVar22 = expf(-fVar22);
          fVar22 = 1.0 / (fVar22 + 1.0);
        }
        *(float *)((long)pvVar4 + lVar19 * 4) = fVar22;
        lVar19 = lVar19 + 1;
        iVar11 = iVar11 + uVar17 * uVar1;
      } while (lVar19 != iVar18);
    }
    return 0;
  }
  pvVar4 = bottom_blob->data;
  piVar5 = bottom_blob->refcount;
  local_a8 = bottom_blob->elemsize;
  pAVar6 = bottom_blob->allocator;
  local_80 = bottom_blob->cstep;
  if (piVar5 != (int *)0x0) {
    LOCK();
    *piVar5 = *piVar5 + 1;
    UNLOCK();
  }
  local_b8 = pvVar4;
  local_b0 = piVar5;
  local_98 = pAVar6;
  if (sVar3 == 1) {
LAB_00136f96:
    if (0 < this->num_output) {
      pvVar4 = top_blob->data;
      pvVar10 = (this->weight_data).data;
      iVar18 = 0;
      lVar19 = 0;
      do {
        iVar21 = 0;
        if (0 < (int)uVar1) {
          lVar16 = (long)iVar18 + (long)pvVar10;
          uVar15 = 0;
          iVar21 = 0;
          pvVar20 = local_b8;
          do {
            if (0 < (int)uVar17) {
              uVar14 = 0;
              do {
                iVar21 = iVar21 + (int)*(char *)(lVar16 + uVar14) *
                                  (int)*(char *)((long)pvVar20 + uVar14);
                uVar14 = uVar14 + 1;
              } while (uVar17 != uVar14);
            }
            uVar15 = uVar15 + 1;
            lVar16 = lVar16 + (int)uVar17;
            pvVar20 = (void *)((long)pvVar20 + local_80 * local_a8);
          } while (uVar15 != uVar1);
        }
        *(int *)((long)pvVar4 + lVar19 * 4) = iVar21;
        lVar19 = lVar19 + 1;
        iVar21 = this->num_output;
        iVar18 = iVar18 + uVar17 * uVar1;
      } while (lVar19 < iVar21);
      if (0 < iVar21) {
        pvVar4 = top_blob->data;
        pvVar10 = (this->weight_data_int8_scales).data;
        iVar18 = this->bias_term;
        iVar2 = this->activation_type;
        pvVar20 = (this->bias_data).data;
        lVar19 = 0;
        do {
          fVar22 = *(float *)((long)pvVar10 + lVar19 * 4);
          fVar22 = (float)*(int *)((long)pvVar4 + lVar19 * 4) *
                   (float)(~-(uint)(fVar22 == 0.0) &
                          (uint)(1.0 / (this->bottom_blob_int8_scale * fVar22)));
          if (iVar18 != 0) {
            fVar22 = fVar22 + *(float *)((long)pvVar20 + lVar19 * 4);
          }
          fVar23 = 0.0;
          if (0.0 <= fVar22) {
            fVar23 = fVar22;
          }
          if (iVar2 != 1) {
            fVar23 = fVar22;
          }
          *(float *)((long)pvVar4 + lVar19 * 4) = fVar23;
          lVar19 = lVar19 + 1;
        } while (iVar21 != lVar19);
      }
    }
    iVar18 = 0;
  }
  else {
    local_98 = opt->workspace_allocator;
    local_80 = (long)(int)uVar17 + 0xfU & 0xfffffffffffffff0;
    uVar15 = local_80 * (long)(int)uVar1;
    if (uVar15 != 0) {
      if (local_98 == (Allocator *)0x0) {
        local_58 = (void *)0x0;
        iVar18 = posix_memalign(&local_58,0x10,uVar15 | 4);
        local_b8 = (void *)0x0;
        if (iVar18 == 0) {
          local_b8 = local_58;
        }
      }
      else {
        local_b8 = (void *)(**(code **)(*(long *)local_98 + 0x10))(local_98,uVar15 | 4);
      }
      local_b0 = (int *)(uVar15 + (long)local_b8);
      *(undefined4 *)((long)local_b8 + uVar15) = 1;
      if ((long)(int)uVar1 * local_80 != 0) {
        local_58 = *(void **)opt;
        local_48 = opt->workspace_allocator;
        uStack_40._0_1_ = opt->use_winograd_convolution;
        uStack_40._1_1_ = opt->use_sgemm_convolution;
        uStack_40._2_1_ = opt->use_int8_inference;
        uStack_40._3_1_ = opt->use_vulkan_compute;
        uStack_40._4_1_ = opt->use_fp16_packed;
        uStack_40._5_1_ = opt->use_fp16_storage;
        uStack_40._6_1_ = opt->use_fp16_arithmetic;
        uStack_40._7_1_ = opt->use_int8_storage;
        local_38._0_1_ = opt->use_int8_arithmetic;
        local_38._1_1_ = opt->use_packing_layout;
        local_38._2_6_ = *(undefined6 *)&opt->field_0x22;
        pAStack_50 = local_98;
        (*this->quantize->_vptr_Layer[7])(this->quantize,bottom_blob);
        if (local_b0 != (int *)0x0) {
          LOCK();
          *local_b0 = *local_b0 + 1;
          UNLOCK();
        }
        if (piVar5 != (int *)0x0) {
          LOCK();
          *piVar5 = *piVar5 + -1;
          UNLOCK();
          if (*piVar5 == 0) {
            if (pAVar6 == (Allocator *)0x0) {
              if (pvVar4 != (void *)0x0) {
                free(pvVar4);
              }
            }
            else {
              (**(code **)(*(long *)pAVar6 + 0x18))();
            }
          }
        }
        local_a8 = 1;
        if (local_b0 != (int *)0x0) {
          LOCK();
          *local_b0 = *local_b0 + -1;
          UNLOCK();
          if (*local_b0 == 0) {
            if (local_98 == (Allocator *)0x0) {
              if (local_b8 != (void *)0x0) {
                free(local_b8);
              }
            }
            else {
              (**(code **)(*(long *)local_98 + 0x18))();
            }
          }
        }
        goto LAB_00136f96;
      }
      LOCK();
      *local_b0 = *local_b0 + -1;
      UNLOCK();
      if (*local_b0 == 0) {
        if (local_98 == (Allocator *)0x0) {
          if (local_b8 != (void *)0x0) {
            free(local_b8);
          }
        }
        else {
          (**(code **)(*(long *)local_98 + 0x18))();
        }
      }
    }
    iVar18 = -100;
    local_b8 = pvVar4;
    local_b0 = piVar5;
    local_98 = pAVar6;
  }
  if (local_b0 != (int *)0x0) {
    LOCK();
    *local_b0 = *local_b0 + -1;
    UNLOCK();
    if (*local_b0 == 0) {
      if (local_98 == (Allocator *)0x0) {
        if (local_b8 != (void *)0x0) {
          free(local_b8);
        }
      }
      else {
        (**(code **)(*(long *)local_98 + 0x18))();
      }
    }
  }
  return iVar18;
}

Assistant:

int InnerProduct::forward(const Mat& bottom_blob, Mat& top_blob, const Option& opt) const
{
    int w = bottom_blob.w;
    int h = bottom_blob.h;
    int channels = bottom_blob.c;
    size_t elemsize = bottom_blob.elemsize;
    int size = w * h;

    top_blob.create(num_output, elemsize, opt.blob_allocator);
    if (top_blob.empty())
        return -100;

    if (use_int8_inference)
    {
        Mat bottom_blob_tm = bottom_blob;
        if (elemsize != 1)
        {
            Mat bottom_blob_int8;
            bottom_blob_int8.create(w, h, channels, (size_t)1u, opt.workspace_allocator);
            if (bottom_blob_int8.empty())
                return -100;

            // quantize, scale and round to nearest
            {
                Option opt_g = opt;
                opt_g.blob_allocator = bottom_blob_int8.allocator;

                quantize->forward(bottom_blob, bottom_blob_int8, opt_g);
            }

            bottom_blob_tm = bottom_blob_int8;
        }

        // num_output
        #pragma omp parallel for num_threads(opt.num_threads)
        for (int p=0; p<num_output; p++)
        {
            int sum = 0;
            int* out = top_blob;

            // channels
            for (int q=0; q<channels; q++)
            {
                const signed char* w = (const signed char*)weight_data + size * channels * p + size * q;
                const signed char* m = bottom_blob_tm.channel(q);

                for (int i = 0; i < size; i++)
                {
                    sum += m[i] * w[i];
                }
            }

            out[p] = sum;       
        }

        #pragma omp parallel for num_threads(opt.num_threads)
        for (int p=0; p<num_output; p++)
        {
            int* out_s32 = top_blob;
            float* out_f32 = top_blob;
            float top_rescale = 1.f;
            if (weight_data_int8_scales[p] == 0)
                top_rescale = 0;
            else
                top_rescale = 1.f / (bottom_blob_int8_scale * weight_data_int8_scales[p]);

            if (bias_term)
                out_f32[p] = out_s32[p] * top_rescale + bias_data[p];
            else
                out_f32[p] = out_s32[p] * top_rescale;

            if (activation_type == 1)
            {
                out_f32[p] = std::max(out_f32[p], 0.f);
            }                
        }

        return 0;
    }

    // num_output
    #pragma omp parallel for num_threads(opt.num_threads)
    for (int p=0; p<num_output; p++)
    {
        float sum = 0.f;

        if (bias_term)
            sum = bias_data[p];

        // channels
        for (int q=0; q<channels; q++)
        {
            const float* w = (const float*)weight_data + size * channels * p + size * q;
            const float* m = bottom_blob.channel(q);

            for (int i = 0; i < size; i++)
            {
                sum += m[i] * w[i];
            }
        }

        if (activation_type == 1)
        {
            sum = std::max(sum, 0.f);
        }
        else if (activation_type == 2)
        {
            float slope = activation_params[0];
            sum = sum > 0.f ? sum : sum * slope;
        }
        else if (activation_type == 3)
        {
            float min = activation_params[0];
            float max = activation_params[1];
            if (sum < min)
                sum = min;
            if (sum > max)
                sum = max;
        }
        else if (activation_type == 4)
        {
            sum = 1.f / (1.f + exp(-sum));
        }

        top_blob[p] = sum;
    }

    return 0;
}